

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaAigerExt.c
# Opt level: O3

uchar * Gia_AigerWriteMappingInt(Gia_Man_t *p,int *pMapSize)

{
  uint uVar1;
  uint uVar2;
  Vec_Int_t *pVVar3;
  int *piVar4;
  byte bVar5;
  ushort uVar9;
  ushort uVar10;
  ushort uVar11;
  ushort uVar12;
  uchar *puVar13;
  ulong uVar14;
  int iVar15;
  ulong uVar16;
  ulong uVar17;
  int iVar18;
  int iVar19;
  ulong uVar20;
  ulong uVar21;
  ulong uVar22;
  uint uVar23;
  uint uVar24;
  byte *pbVar25;
  ulong uVar26;
  byte bVar6;
  byte bVar7;
  byte bVar8;
  
  pVVar3 = p->vMapping;
  if (pVVar3 == (Vec_Int_t *)0x0) {
    __assert_fail("Gia_ManHasMapping(p)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/giaAigerExt.c"
                  ,0xae,"unsigned char *Gia_AigerWriteMappingInt(Gia_Man_t *, int *)");
  }
  iVar19 = p->nObjs;
  uVar26 = (ulong)iVar19;
  if ((long)uVar26 < 2) {
    puVar13 = (uchar *)malloc(4);
    uVar24 = 4;
  }
  else {
    uVar24 = pVVar3->nSize;
    uVar14 = 1;
    if (1 < (int)uVar24) {
      uVar14 = (ulong)uVar24;
    }
    iVar15 = 0;
    uVar17 = 1;
    do {
      if (uVar14 == uVar17) goto LAB_00651e69;
      uVar1 = pVVar3->pArray[uVar17];
      if ((ulong)uVar1 != 0) {
        if (((int)uVar1 < 0) || (uVar24 <= uVar1)) goto LAB_00651e69;
        iVar15 = iVar15 + pVVar3->pArray[uVar1] + 2;
      }
      uVar17 = uVar17 + 1;
    } while (uVar26 != uVar17);
    puVar13 = (uchar *)malloc((long)iVar15 * 4 + 4);
    uVar24 = 4;
    if (1 < iVar19) {
      uVar1 = pVVar3->nSize;
      uVar14 = 1;
      if (1 < (int)uVar1) {
        uVar14 = (ulong)uVar1;
      }
      iVar19 = 0;
      uVar24 = 4;
      uVar17 = 1;
      do {
        if (uVar17 == uVar14) {
LAB_00651e69:
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecInt.h"
                        ,0x19e,"int Vec_IntEntry(Vec_Int_t *, int)");
        }
        piVar4 = pVVar3->pArray;
        uVar2 = piVar4[uVar17];
        uVar20 = (ulong)uVar2;
        if (uVar20 != 0) {
          if (((int)uVar2 < 0) || (uVar1 <= uVar2)) goto LAB_00651e69;
          uVar2 = piVar4[uVar20];
          uVar21 = (ulong)uVar2;
          uVar22 = uVar21;
          if (0x7f < uVar21) {
            pbVar25 = puVar13 + (int)uVar24;
            do {
              uVar23 = (uint)uVar22;
              *pbVar25 = (byte)uVar22 | 0x80;
              uVar22 = uVar22 >> 7;
              pbVar25 = pbVar25 + 1;
              uVar24 = uVar24 + 1;
            } while (0x3fff < uVar23);
          }
          puVar13[(int)uVar24] = (uchar)uVar22;
          iVar15 = uVar24 + 1;
          if (0 < (int)uVar2) {
            uVar22 = 0;
            iVar18 = iVar19;
            do {
              iVar19 = piVar4[uVar20 + uVar22 + 1];
              uVar24 = iVar18 - iVar19;
              if (iVar18 < iVar19) {
                uVar24 = iVar19 - iVar18;
                if ((int)uVar24 < 0) goto LAB_00651e4a;
                uVar16 = (ulong)(uVar24 * 2 + 1);
                if (0x3f < uVar24) {
                  pbVar25 = puVar13 + iVar15;
                  do {
                    uVar24 = (uint)uVar16;
                    *pbVar25 = (byte)uVar16 | 0x80;
                    uVar16 = uVar16 >> 7;
                    pbVar25 = pbVar25 + 1;
                    iVar15 = iVar15 + 1;
                  } while (0x3fff < uVar24);
                }
              }
              else {
                if ((int)uVar24 < 0) goto LAB_00651e4a;
                uVar16 = (ulong)(uVar24 * 2);
                if (0x3f < uVar24) {
                  pbVar25 = puVar13 + iVar15;
                  do {
                    uVar24 = (uint)uVar16;
                    *pbVar25 = (byte)uVar16 | 0x80;
                    uVar16 = uVar16 >> 7;
                    pbVar25 = pbVar25 + 1;
                    iVar15 = iVar15 + 1;
                  } while (0x3fff < uVar24);
                }
              }
              puVar13[iVar15] = (uchar)uVar16;
              uVar22 = uVar22 + 1;
              iVar15 = iVar15 + 1;
              iVar18 = iVar19;
            } while (uVar22 != uVar21);
          }
          iVar18 = (int)uVar17;
          if ((long)iVar19 < (long)uVar17) {
            uVar24 = iVar18 - iVar19;
            if ((int)uVar24 < 0) {
LAB_00651e4a:
              __assert_fail("Var >= 0 && !(c >> 1)",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/util/abc_global.h"
                            ,0x10b,"int Abc_Var2Lit(int, int)");
            }
            uVar20 = (ulong)(uVar24 * 2 + 1);
            if (0x3f < uVar24) {
              pbVar25 = puVar13 + iVar15;
              do {
                uVar24 = (uint)uVar20;
                *pbVar25 = (byte)uVar20 | 0x80;
                uVar20 = uVar20 >> 7;
                pbVar25 = pbVar25 + 1;
                iVar15 = iVar15 + 1;
              } while (0x3fff < uVar24);
            }
          }
          else {
            uVar24 = iVar19 - iVar18;
            if ((int)uVar24 < 0) goto LAB_00651e4a;
            uVar20 = (ulong)(uVar24 * 2);
            if (0x3f < uVar24) {
              pbVar25 = puVar13 + iVar15;
              do {
                uVar24 = (uint)uVar20;
                *pbVar25 = (byte)uVar20 | 0x80;
                uVar20 = uVar20 >> 7;
                pbVar25 = pbVar25 + 1;
                iVar15 = iVar15 + 1;
              } while (0x3fff < uVar24);
            }
          }
          puVar13[iVar15] = (uchar)uVar20;
          uVar24 = iVar15 + 1;
          iVar19 = iVar18;
        }
        uVar17 = uVar17 + 1;
      } while (uVar17 != uVar26);
    }
  }
  uVar10 = (ushort)(uVar24 >> 0x10) & 0xff;
  uVar11 = (ushort)(uVar24 >> 8) & 0xff;
  uVar12 = (ushort)uVar24 & 0xff;
  bVar5 = (byte)(uVar24 >> 0x18);
  uVar9 = (ushort)bVar5;
  bVar5 = (uVar9 != 0) * (uVar9 < 0x100) * bVar5 - (0xff < uVar9);
  bVar6 = ((uVar24 & 0xff0000) != 0) * (uVar10 < 0x100) * (char)(uVar24 >> 0x10) - (0xff < uVar10);
  bVar7 = ((uVar24 & 0xff00) != 0) * (uVar11 < 0x100) * (char)(uVar24 >> 8) - (0xff < uVar11);
  bVar8 = ((uVar24 & 0xff) != 0) * (uVar12 < 0x100) * (char)uVar24 - (0xff < uVar12);
  *(uint *)puVar13 =
       CONCAT13((bVar8 != 0) * (bVar8 < 0x100) * bVar8 - (0xff < bVar8),
                CONCAT12((bVar7 != 0) * (bVar7 < 0x100) * bVar7 - (0xff < bVar7),
                         CONCAT11((bVar6 != 0) * (bVar6 < 0x100) * bVar6 - (0xff < bVar6),
                                  (bVar5 != 0) * (bVar5 < 0x100) * bVar5 - (0xff < bVar5))));
  *pMapSize = uVar24;
  return puVar13;
}

Assistant:

unsigned char * Gia_AigerWriteMappingInt( Gia_Man_t * p, int * pMapSize )
{
    unsigned char * pBuffer;
    int i, k, iPrev, iFan, nItems, iPos = 4;
    assert( Gia_ManHasMapping(p) );
    // count the number of entries to be written
    nItems = 0;
    Gia_ManForEachLut( p, i )
        nItems += 2 + Gia_ObjLutSize( p, i );
    pBuffer = ABC_ALLOC( unsigned char, sizeof(int) * (nItems + 1) );
    // write non-constant classes
    iPrev = 0;
    Gia_ManForEachLut( p, i )
    {
//printf( "\nSize = %d ", Gia_ObjLutSize(p, i) );
        iPos = Gia_AigerWriteUnsignedBuffer( pBuffer, iPos, Gia_ObjLutSize(p, i) );
        Gia_LutForEachFanin( p, i, iFan, k )
        {
//printf( "Fan = %d ", iFan );
            iPos = Gia_AigerWriteDiffValue( pBuffer, iPos, iPrev, iFan );
            iPrev = iFan;
        }
        iPos = Gia_AigerWriteDiffValue( pBuffer, iPos, iPrev, i );
        iPrev = i;
//printf( "Node = %d ", i );
    }
//printf( "\n" );
    Gia_AigerWriteInt( pBuffer, iPos );
    *pMapSize = iPos;
    return pBuffer;
}